

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_string_view_type.hpp
# Opt level: O2

void __thiscall
duckdb::arrow_string_view_t::arrow_string_view_t
          (arrow_string_view_t *this,int32_t length,char *data)

{
  uchar uVar1;
  
  *(int32_t *)this = length;
  switchD_00917c1c::default(this + 4,data,(long)length);
  if (length < 0xc) {
    uVar1 = NumericCastImpl<unsigned_char,_int,_false>::Convert(length);
    switchD_004a0b15::default(this + 4 + length,0,(ulong)(byte)(0xc - uVar1));
    return;
  }
  return;
}

Assistant:

arrow_string_view_t(int32_t length, const char *data) {
		D_ASSERT(length <= ArrowStringViewConstants::MAX_INLINED_BYTES);
		inlined.length = length;
		memcpy(inlined.data, data, UnsafeNumericCast<idx_t>(length));
		if (length < ArrowStringViewConstants::MAX_INLINED_BYTES) {
			// have to 0 pad
			uint8_t remaining_bytes = ArrowStringViewConstants::MAX_INLINED_BYTES - NumericCast<uint8_t>(length);

			memset(&inlined.data[length], '\0', remaining_bytes);
		}
	}